

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ModelDescription::Clear(ModelDescription *this)

{
  Metadata *this_00;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  ModelDescription *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Clear
            (&this->input_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Clear
            (&this->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Clear
            (&this->state_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::Clear
            (&this->functions_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Clear
            (&this->traininginput_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->predictedfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->predictedprobabilitiesname_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->defaultfunctionname_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->metadata_ != (Metadata *)0x0)) &&
     (this_00 = this->metadata_, this_00 != (Metadata *)0x0)) {
    Metadata::~Metadata(this_00);
    operator_delete(this_00,0x68);
  }
  this->metadata_ = (Metadata *)0x0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ModelDescription::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ModelDescription)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  input_.Clear();
  output_.Clear();
  state_.Clear();
  functions_.Clear();
  traininginput_.Clear();
  predictedfeaturename_.ClearToEmpty();
  predictedprobabilitiesname_.ClearToEmpty();
  defaultfunctionname_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && metadata_ != nullptr) {
    delete metadata_;
  }
  metadata_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}